

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

void llvm::APInt::sdivrem(APInt *LHS,APInt *RHS,APInt *Quotient,APInt *Remainder)

{
  APInt *LHS_00;
  bool bVar1;
  APInt local_a8;
  APInt local_98;
  APInt local_88;
  APInt local_78;
  APInt local_68;
  APInt local_58;
  APInt local_48;
  APInt local_38;
  APInt *local_28;
  APInt *Remainder_local;
  APInt *Quotient_local;
  APInt *RHS_local;
  APInt *LHS_local;
  
  local_28 = Remainder;
  Remainder_local = Quotient;
  Quotient_local = RHS;
  RHS_local = LHS;
  bVar1 = isNegative(LHS);
  if (bVar1) {
    bVar1 = isNegative(Quotient_local);
    if (bVar1) {
      APInt(&local_48,RHS_local);
      llvm::operator-((llvm *)&local_38,&local_48);
      APInt(&local_68,Quotient_local);
      llvm::operator-((llvm *)&local_58,&local_68);
      udivrem(&local_38,&local_58,Remainder_local,local_28);
      ~APInt(&local_58);
      ~APInt(&local_68);
      ~APInt(&local_38);
      ~APInt(&local_48);
    }
    else {
      APInt(&local_88,RHS_local);
      llvm::operator-((llvm *)&local_78,&local_88);
      udivrem(&local_78,Quotient_local,Remainder_local,local_28);
      ~APInt(&local_78);
      ~APInt(&local_88);
      negate(Remainder_local);
    }
    negate(local_28);
  }
  else {
    bVar1 = isNegative(Quotient_local);
    LHS_00 = RHS_local;
    if (bVar1) {
      APInt(&local_a8,Quotient_local);
      llvm::operator-((llvm *)&local_98,&local_a8);
      udivrem(LHS_00,&local_98,Remainder_local,local_28);
      ~APInt(&local_98);
      ~APInt(&local_a8);
      negate(Remainder_local);
    }
    else {
      udivrem(RHS_local,Quotient_local,Remainder_local,local_28);
    }
  }
  return;
}

Assistant:

void APInt::sdivrem(const APInt &LHS, const APInt &RHS,
                    APInt &Quotient, APInt &Remainder) {
  if (LHS.isNegative()) {
    if (RHS.isNegative())
      APInt::udivrem(-LHS, -RHS, Quotient, Remainder);
    else {
      APInt::udivrem(-LHS, RHS, Quotient, Remainder);
      Quotient.negate();
    }
    Remainder.negate();
  } else if (RHS.isNegative()) {
    APInt::udivrem(LHS, -RHS, Quotient, Remainder);
    Quotient.negate();
  } else {
    APInt::udivrem(LHS, RHS, Quotient, Remainder);
  }
}